

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O0

void __thiscall sc_core::vcd_trace_file::~vcd_trace_file(vcd_trace_file *this)

{
  bool bVar1;
  sc_trace_file_base *this_00;
  reference ppvVar2;
  sc_trace_file_base *in_RDI;
  vcd_trace *t;
  int i;
  unit_type now_units_low;
  unit_type now_units_high;
  unit_type in_stack_000001a0;
  unit_type in_stack_000001a8;
  vcd_trace_file *in_stack_000001b0;
  unit_type *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar3;
  vcd_trace_file *in_stack_ffffffffffffffb0;
  int local_28;
  
  (in_RDI->super_sc_trace_file)._vptr_sc_trace_file = (_func_int **)&PTR_trace_00365dd0;
  (in_RDI->super_sc_object)._vptr_sc_object = (_func_int **)&PTR_print_00365f10;
  bVar1 = sc_trace_file_base::is_initialized(in_RDI);
  if ((bVar1) &&
     (bVar1 = get_time_stamp(in_stack_ffffffffffffffb0,
                             (unit_type *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             in_stack_ffffffffffffffa0), bVar1)) {
    print_time_stamp(in_stack_000001b0,in_stack_000001a8,in_stack_000001a0);
  }
  local_28 = 0;
  while (iVar3 = local_28,
        this_00 = (sc_trace_file_base *)
                  std::vector<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>::size
                            ((vector<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_> *)
                             &in_RDI[1].super_sc_object.m_attr_cltn_p), iVar3 < (int)this_00) {
    ppvVar2 = std::vector<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>::operator[]
                        ((vector<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_> *)
                         &in_RDI[1].super_sc_object.m_attr_cltn_p,(long)local_28);
    if (*ppvVar2 != (vcd_trace *)0x0) {
      (*(*ppvVar2)->_vptr_vcd_trace[5])();
    }
    local_28 = local_28 + 1;
  }
  std::vector<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>::~vector
            ((vector<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_> *)in_RDI);
  sc_trace_file_base::~sc_trace_file_base(this_00);
  return;
}

Assistant:

vcd_trace_file::~vcd_trace_file()
{
    unit_type now_units_high, now_units_low;
    if (is_initialized() && get_time_stamp(now_units_high,now_units_low)) {
        print_time_stamp(now_units_high, now_units_low);
    }

    for( int i = 0; i < (int)traces.size(); i++ ) {
        vcd_trace* t = traces[i];
        delete t;
    }
}